

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

int Gia_ManBuiltInSimPack(Gia_Man_t *p,Vec_Int_t *vPat)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = vPat->nSize;
  if ((int)uVar1 < 1) {
    __assert_fail("Vec_IntSize(vPat) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x3b5,"int Gia_ManBuiltInSimPack(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->iPatsPi < 1) {
    return -1;
  }
  uVar5 = 0;
LAB_0022744b:
  bVar3 = (byte)uVar5 & 0x3f;
  uVar4 = 0;
  do {
    uVar2 = vPat->pArray[uVar4];
    if ((int)uVar2 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar6 = p->nSimWords * (uVar2 >> 1);
    if (((int)uVar6 < 0) || (p->vSimsPi->nSize <= (int)uVar6)) {
LAB_00227505:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    if ((p->vSimsPi->pArray[(ulong)uVar6 + (ulong)(uVar5 >> 6)] & 1L << bVar3) != 0) {
      uVar6 = p->nSimWords * ((uVar2 >> 1) + 1);
      if (((int)uVar6 < 0) || (p->vSims->nSize <= (int)uVar6)) goto LAB_00227505;
      if (((uVar2 ^ (uint)(p->vSims->pArray[(ulong)uVar6 + (ulong)(uVar5 >> 6)] >> bVar3)) & 1) == 0
         ) break;
    }
    uVar4 = uVar4 + 1;
    if (uVar1 == uVar4) {
      return uVar5;
    }
  } while( true );
  if (uVar1 == (uint)uVar4) {
    return uVar5;
  }
  uVar5 = uVar5 + 1;
  if (uVar5 == p->iPatsPi) {
    return -1;
  }
  goto LAB_0022744b;
}

Assistant:

int Gia_ManBuiltInSimPack( Gia_Man_t * p, Vec_Int_t * vPat )
{
    int i, k, iLit;
    assert( Vec_IntSize(vPat) > 0 );
    //printf( "%d ", Vec_IntSize(vPat) );
    for ( i = 0; i < p->iPatsPi; i++ )
    {
        Vec_IntForEachEntry( vPat, iLit, k )
            if ( Abc_TtGetBit(Gia_ManBuiltInDataPi(p, Abc_Lit2Var(iLit)), i) && 
                 Abc_TtGetBit(Gia_ManBuiltInData(p, 1+Abc_Lit2Var(iLit)), i) == Abc_LitIsCompl(iLit) )
                break;
        if ( k == Vec_IntSize(vPat) )
            return i; // success
    }
    return -1; // failure
}